

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine.cpp
# Opt level: O0

GLuint __thiscall
QOpenGL2PaintEngineExPrivate::bindTexture<QGradient>
          (QOpenGL2PaintEngineExPrivate *this,QGradient *gradient,bool *newTextureCreated)

{
  GLuint GVar1;
  GLuint *in_RDX;
  QOpenGL2PaintEngineExPrivate *in_RSI;
  long in_FS_OFFSET;
  QGradient *unaff_retaddr;
  QOpenGL2GradientCache *in_stack_00000008;
  GLuint textureId;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  qreal opacity;
  
  opacity = *(qreal *)(in_FS_OFFSET + 0x28);
  QPointer::operator_cast_to_QOpenGLContext_((QPointer<QOpenGLContext> *)0x15bb0a);
  QOpenGL2GradientCache::cacheForContext((QOpenGLContext *)0x15bb12);
  QOpenGL2GradientCache::getBuffer(in_stack_00000008,unaff_retaddr,opacity);
  GVar1 = bindTexture<unsigned_int>
                    (in_RSI,in_RDX,
                     (bool *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (*(qreal *)(in_FS_OFFSET + 0x28) == opacity) {
    return GVar1;
  }
  __stack_chk_fail();
}

Assistant:

GLuint QOpenGL2PaintEngineExPrivate::bindTexture(const QGradient &gradient, bool *newTextureCreated)
{
    // We apply global opacity in the fragment shaders, so we always pass 1.0
    // for opacity to the cache.
    GLuint textureId = QOpenGL2GradientCache::cacheForContext(ctx)->getBuffer(gradient, 1.0);

    // QOpenGL2GradientCache::getBuffer() may bind and generate a new texture if it
    // hasn't been cached yet, but will otherwise return an unbound texture id. To
    // be sure that the texture is bound, we unfortunately have to bind again,
    // which results in the initial generation of the texture doing two binds.
    return bindTexture(textureId, newTextureCreated);
}